

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QPointer<QAbstractItemDelegate> __thiscall
QMap<int,_QPointer<QAbstractItemDelegate>_>::value
          (QMap<int,_QPointer<QAbstractItemDelegate>_> *this,int *key,
          QPointer<QAbstractItemDelegate> *defaultValue)

{
  const_iterator cVar1;
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *pQVar2;
  undefined8 *in_RCX;
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *pQVar3;
  QObject *extraout_RDX;
  QPointer<QAbstractItemDelegate> QVar4;
  
  if (*(long *)key != 0) {
    cVar1 = std::
            _Rb_tree<int,_std::pair<const_int,_QPointer<QAbstractItemDelegate>_>,_std::_Select1st<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>
            ::find((_Rb_tree<int,_std::pair<const_int,_QPointer<QAbstractItemDelegate>_>,_std::_Select1st<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>
                    *)(*(long *)key + 8),(key_type *)defaultValue);
    defaultValue = (QPointer<QAbstractItemDelegate> *)extraout_RDX;
    if (cVar1._M_node != (_Base_ptr)(*(long *)key + 0x10)) {
      pQVar3 = (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                *)cVar1._M_node[1]._M_parent;
      (this->d).d.ptr = pQVar3;
      pQVar2 = (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                *)cVar1._M_node[1]._M_left;
      goto LAB_004ec737;
    }
  }
  pQVar3 = (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
            *)*in_RCX;
  (this->d).d.ptr = pQVar3;
  pQVar2 = (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
            *)in_RCX[1];
LAB_004ec737:
  this[1].d.d.ptr = pQVar2;
  if (pQVar3 != (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 *)0x0) {
    LOCK();
    (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + _S_black);
    UNLOCK();
  }
  QVar4.wp.value = (QObject *)defaultValue;
  QVar4.wp.d = (Data *)this;
  return (QPointer<QAbstractItemDelegate>)QVar4.wp;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }